

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::removeRows_data(tst_GenericModel *this)

{
  QTestData *pQVar1;
  int local_1c [3];
  tst_GenericModel *local_10;
  tst_GenericModel *this_local;
  
  local_10 = this;
  QTest::addColumn<int>("insertCol",(int *)0x0);
  pQVar1 = (QTestData *)QTest::newRow("No Columns");
  local_1c[2] = 0;
  ::operator<<(pQVar1,local_1c + 2);
  pQVar1 = (QTestData *)QTest::newRow("One Column");
  local_1c[1] = 1;
  ::operator<<(pQVar1,local_1c + 1);
  pQVar1 = (QTestData *)QTest::newRow("Multiple Columns");
  local_1c[0] = 3;
  ::operator<<(pQVar1,local_1c);
  return;
}

Assistant:

void tst_GenericModel::removeRows_data()
{
    QTest::addColumn<int>("insertCol");
#ifndef SKIP_QTBUG_92886
    QTest::newRow("No Columns") << 0;
#endif
    QTest::newRow("One Column") << 1;
    QTest::newRow("Multiple Columns") << 3;
}